

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall
cmTarget::AddSources
          (cmTarget *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *srcs)

{
  undefined8 this_00;
  bool bVar1;
  reference pbVar2;
  ulong uVar3;
  pointer pcVar4;
  undefined1 local_c0 [8];
  cmListFileBacktrace lfbt;
  string local_a8;
  undefined1 local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> filename;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  char *sep;
  string srcFiles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *srcs_local;
  cmTarget *this_local;
  
  srcFiles.field_2._8_8_ = srcs;
  std::__cxx11::string::string((string *)&sep);
  this_00 = srcFiles.field_2._8_8_;
  __range1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0xc7f107;
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)srcFiles.field_2._8_8_);
  filename.field_2._8_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)((long)&filename.field_2 + 8)), bVar1) {
    pbVar2 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
    std::__cxx11::string::string((string *)local_78,(string *)pbVar2);
    bVar1 = cmGeneratorExpression::StartsWithGeneratorExpression((string *)local_78);
    if (bVar1) {
LAB_002ca4ac:
      std::__cxx11::string::operator+=((string *)&sep,(char *)__range1);
      std::__cxx11::string::operator+=((string *)&sep,(string *)local_78);
      __range1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0xc18e4f;
      lfbt.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._4_4_ = 0;
    }
    else {
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) != 0) {
LAB_002ca48b:
        pcVar4 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                 operator->(&this->impl);
        cmMakefile::GetOrCreateSource(pcVar4->Makefile,(string *)local_78,false,Ambiguous);
        goto LAB_002ca4ac;
      }
      pcVar4 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
               operator->(&this->impl);
      cmTargetInternals::ProcessSourceItemCMP0049(&local_a8,pcVar4,(string *)local_78);
      std::__cxx11::string::operator=((string *)local_78,(string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) goto LAB_002ca48b;
      lfbt.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._4_4_ = 1;
    }
    std::__cxx11::string::~string((string *)local_78);
    if (lfbt.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi._4_4_ != 0) goto LAB_002ca58d;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
              (&this->impl);
    cmMakefile::GetBacktrace((cmMakefile *)local_c0);
    pcVar4 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                       (&this->impl);
    std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
    emplace_back<std::__cxx11::string,cmListFileBacktrace&>
              ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
               &pcVar4->SourceEntries,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sep,
               (cmListFileBacktrace *)local_c0);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_c0);
  }
  lfbt.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._4_4_ = 0;
LAB_002ca58d:
  std::__cxx11::string::~string((string *)&sep);
  return;
}

Assistant:

void cmTarget::AddSources(std::vector<std::string> const& srcs)
{
  std::string srcFiles;
  const char* sep = "";
  for (auto filename : srcs) {
    if (!cmGeneratorExpression::StartsWithGeneratorExpression(filename)) {
      if (!filename.empty()) {
        filename = this->impl->ProcessSourceItemCMP0049(filename);
        if (filename.empty()) {
          return;
        }
      }
      this->impl->Makefile->GetOrCreateSource(filename);
    }
    srcFiles += sep;
    srcFiles += filename;
    sep = ";";
  }
  if (!srcFiles.empty()) {
    cmListFileBacktrace lfbt = this->impl->Makefile->GetBacktrace();
    this->impl->SourceEntries.emplace_back(std::move(srcFiles), lfbt);
  }
}